

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Interpolation interp)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "constant";
    paVar1 = &local_a;
    break;
  case 1:
    pcVar2 = "uniform";
    paVar1 = &local_b;
    break;
  case 2:
    pcVar2 = "varying";
    paVar1 = &local_c;
    break;
  case 3:
    pcVar2 = "vertex";
    paVar1 = &local_d;
    break;
  case 4:
    pcVar2 = "faceVarying";
    paVar1 = &local_e;
    break;
  case 5:
    pcVar2 = "[[Invalid interpolation value]]";
    paVar1 = &local_9;
    break;
  default:
    pcVar2 = "[[Invalid interpolation value]]";
    paVar1 = &local_f;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::Interpolation interp) {
  switch (interp) {
    case Interpolation::Invalid:
      return "[[Invalid interpolation value]]";
    case Interpolation::Constant:
      return "constant";
    case Interpolation::Uniform:
      return "uniform";
    case Interpolation::Varying:
      return "varying";
    case Interpolation::Vertex:
      return "vertex";
    case Interpolation::FaceVarying:
      return "faceVarying";
  }

  // Never reach here though
  return "[[Invalid interpolation value]]";
}